

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

void compactor_switch_file(filemgr *old_file,filemgr *new_file,err_log_callback *log_callback)

{
  avl_node *paVar1;
  avl_node *in_RSI;
  undefined8 *in_RDI;
  fdb_compaction_mode_t comp_mode;
  char metafile [1024];
  compactor_meta meta;
  openfiles_elem_conflict *elem;
  openfiles_elem_conflict query;
  avl_node *a;
  char *in_stack_fffffffffffff278;
  undefined7 in_stack_fffffffffffff280;
  char cVar2;
  avl_cmp_func *in_stack_fffffffffffff288;
  avl_node *in_stack_fffffffffffff290;
  avl_tree *in_stack_fffffffffffff298;
  avl_node *in_stack_fffffffffffff2a0;
  avl_node *in_stack_fffffffffffff2a8;
  avl_tree *in_stack_fffffffffffff2b0;
  err_log_callback *in_stack_fffffffffffff898;
  compactor_meta *in_stack_fffffffffffff8a0;
  char *in_stack_fffffffffffff8a8;
  char local_560 [1344];
  avl_node *local_20;
  avl_node *local_10;
  
  local_20 = (avl_node *)0x0;
  local_10 = in_RSI;
  strcpy(local_560,(char *)*in_RDI);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(in_stack_fffffffffffff298,in_stack_fffffffffffff290,in_stack_fffffffffffff288)
  ;
  local_20 = paVar1;
  if (paVar1 == (avl_node *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  }
  else {
    avl_remove(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
    strcpy((char *)(paVar1 + -0x36),(char *)local_10->parent);
    paVar1[-0xc].right = local_10;
    *(undefined4 *)&paVar1[-1].left = 1;
    *(undefined1 *)((long)&paVar1[-1].left + 5) = 0;
    *(undefined1 *)((long)&paVar1[-1].left + 4) = 0;
    gettimeofday((timeval *)(paVar1 + 1),(__timezone_ptr_t)0x0);
    avl_insert((avl_tree *)in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
               (avl_cmp_func *)in_stack_fffffffffffff298);
    cVar2 = *(char *)((long)&paVar1[-10].right + 6);
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    if (cVar2 == '\x01') {
      _compactor_convert_dbfile_to_metafile
                ((char *)CONCAT17(1,in_stack_fffffffffffff280),in_stack_fffffffffffff278);
      _strcpy_fname((char *)CONCAT17(cVar2,in_stack_fffffffffffff280),in_stack_fffffffffffff278);
      _compactor_store_metafile
                (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    }
  }
  return;
}

Assistant:

void compactor_switch_file(struct filemgr *old_file, struct filemgr *new_file,
                           err_log_callback *log_callback)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;
    struct compactor_meta meta;

    strcpy(query.filename, old_file->filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        char metafile[MAX_FNAMELEN];
        fdb_compaction_mode_t comp_mode;

        elem = _get_entry(a, struct openfiles_elem, avl);
        avl_remove(&openfiles, a);
        strcpy(elem->filename, new_file->filename);
        elem->file = new_file;
        elem->register_count = 1;
        elem->daemon_compact_in_progress = false;
        // clear compaction flag
        elem->compaction_flag = false;
        // As this function is invoked at the end of compaction, set the compaction
        // timestamp to the current time.
        gettimeofday(&elem->last_compaction_timestamp, NULL);
        avl_insert(&openfiles, &elem->avl, _compactor_cmp);
        comp_mode = elem->config.compaction_mode;
        mutex_unlock(&cpt_lock); // Releasing the lock here should be OK as we don't
                                 // expect more than one compaction task completion for
                                 // the same file.

        if (comp_mode == FDB_COMPACTION_AUTO) {
            _compactor_convert_dbfile_to_metafile(new_file->filename, metafile);
            _strcpy_fname(meta.filename, new_file->filename);
            _compactor_store_metafile(metafile, &meta, log_callback);
        }
    } else {
        mutex_unlock(&cpt_lock);
    }
}